

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O0

REF_STATUS ref_geom_constrain_all(REF_GRID ref_grid)

{
  REF_NODE pRVar1;
  uint uVar2;
  int local_24;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_NODE ref_node;
  REF_GRID ref_grid_local;
  
  pRVar1 = ref_grid->node;
  local_24 = 0;
  while( true ) {
    if (pRVar1->max <= local_24) {
      return 0;
    }
    if ((((-1 < local_24) && (local_24 < pRVar1->max)) && (-1 < pRVar1->global[local_24])) &&
       (uVar2 = ref_geom_constrain(ref_grid,local_24), uVar2 != 0)) break;
    local_24 = local_24 + 1;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0x5fe,
         "ref_geom_constrain_all",(ulong)uVar2,"constrain node");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_geom_constrain_all(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) {
    RSS(ref_geom_constrain(ref_grid, node), "constrain node");
  }
  return REF_SUCCESS;
}